

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

wt_object wt_init(wave_object wave,char *method,int siglength,int J)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  char *pcVar6;
  wt_object pwVar7;
  size_t __n;
  
  if (100 < J) {
    pcVar6 = "\n The Decomposition Iterations Cannot Exceed 100. Exiting ";
    goto LAB_001028c6;
  }
  iVar5 = wave->filtlength;
  uVar2 = wmaxiter(siglength);
  if ((int)uVar2 < J) {
    printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n",
           (ulong)uVar2);
    goto LAB_001028de;
  }
  if (((method == (char *)0x0) || (iVar3 = strcmp(method,"dwt"), iVar3 == 0)) ||
     (iVar3 = strcmp(method,"DWT"), iVar3 == 0)) {
    iVar3 = siglength + (iVar5 + 1) * J * 2;
    pwVar7 = (wt_object)malloc((long)iVar3 * 8 + 0x1f8);
    uVar4 = 0x6d7973;
    goto LAB_0010276d;
  }
  iVar3 = strcmp(method,"swt");
  if ((iVar3 == 0) || (iVar3 = strcmp(method,"SWT"), iVar3 == 0)) {
    iVar3 = testSWTlength(siglength,J);
    if (iVar3 == 0) {
      pcVar6 = "\n For SWT the signal length must be a multiple of 2^J. ";
      goto LAB_001028c6;
    }
    iVar3 = (J + 1) * siglength;
    iVar1 = iVar3;
  }
  else {
    pcVar6 = strstr(wave->wname,"haar");
    if (((pcVar6 == (char *)0x0) && (pcVar6 = strstr(wave->wname,"db"), pcVar6 == (char *)0x0)) &&
       ((pcVar6 = strstr(wave->wname,"sym"), pcVar6 == (char *)0x0 &&
        (pcVar6 = strstr(wave->wname,"coif"), pcVar6 == (char *)0x0)))) {
      pcVar6 = "\n MODWT is only implemented for orthogonal wavelet families - db, sym and coif ";
LAB_001028c6:
      puts(pcVar6);
LAB_001028de:
      exit(-1);
    }
    iVar3 = (J + 1) * siglength;
    iVar1 = iVar3 * 2;
  }
  pwVar7 = (wt_object)malloc((long)iVar1 * 8 + 0x1f8);
  uVar4 = 0x726570;
LAB_0010276d:
  pwVar7->outlength = iVar3;
  *(undefined4 *)pwVar7->ext = uVar4;
  pwVar7->wave = wave;
  pwVar7->siglength = siglength;
  pwVar7->modwtsiglength = siglength;
  pwVar7->J = J;
  pwVar7->MaxIter = uVar2;
  strcpy(pwVar7->method,method);
  pwVar7->even = ~siglength & 1;
  pwVar7->cobj = (conv_object)0x0;
  builtin_strncpy(pwVar7->cmethod,"direct",7);
  pwVar7->cfftset = 0;
  pwVar7->lenlength = J + 2;
  pwVar7->output = (double *)(pwVar7 + 1);
  iVar3 = strcmp(method,"dwt");
  if ((iVar3 == 0) || (iVar3 = strcmp(method,"DWT"), iVar3 == 0)) {
    iVar5 = siglength + J * (iVar5 + 1) * 2;
    if (iVar5 < 1) {
      return pwVar7;
    }
    __n = (ulong)(iVar5 - 1) * 8 + 8;
  }
  else {
    iVar5 = strcmp(method,"swt");
    if ((iVar5 == 0) || (iVar5 = strcmp(method,"SWT"), iVar5 == 0)) {
      uVar2 = (J + 1) * siglength;
    }
    else {
      iVar5 = strcmp(method,"modwt");
      if ((iVar5 != 0) && (iVar5 = strcmp(method,"MODWT"), iVar5 != 0)) {
        return pwVar7;
      }
      uVar2 = siglength * (J + 1) * 2;
    }
    if ((int)uVar2 < 1) {
      return pwVar7;
    }
    __n = (ulong)uVar2 << 3;
  }
  memset(pwVar7 + 1,0,__n);
  return pwVar7;
}

Assistant:

wt_object wt_init(wave_object wave,const char* method, int siglength,int J) {
	int size,i,MaxIter;
	wt_object obj = NULL;

	size = wave->filtlength;

	if (J > 100) {
		printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
		exit(-1);
	}

	MaxIter = wmaxiter(siglength);

	if (J > MaxIter) {
		printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n",MaxIter);
		exit(-1);
	}

	if (method == NULL) {
		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength +  2 * J * (size+1)));
		obj->outlength = siglength + 2 * J * (size + 1); // Default
		strcpy(obj->ext, "sym"); // Default
	}
	else if (!strcmp(method, "dwt") || !strcmp(method, "DWT")) {
		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength + 2 * J * (size + 1)));
		obj->outlength = siglength + 2 * J * (size + 1); // Default
		strcpy(obj->ext, "sym"); // Default
	}
	else if (!strcmp(method, "swt") || !strcmp(method, "SWT")) {
		if (!testSWTlength(siglength, J)) {
			printf("\n For SWT the signal length must be a multiple of 2^J. \n");
			exit(-1);
		}

		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength * (J + 1)));
		obj->outlength = siglength * (J + 1); // Default
		strcpy(obj->ext, "per"); // Default
	}
	else if (!strcmp(method, "modwt") || !strcmp(method, "MODWT")) {

		if (!strstr(wave->wname,"haar")) {
			if (!strstr(wave->wname,"db")) {
				if (!strstr(wave->wname, "sym")) {
					if (!strstr(wave->wname, "coif")) {
						printf("\n MODWT is only implemented for orthogonal wavelet families - db, sym and coif \n");
						exit(-1);
					}
				}
			}
		}

		obj = (wt_object)malloc(sizeof(struct wt_set) + sizeof(double)* (siglength * 2 * (J + 1)));
		obj->outlength = siglength * (J + 1); // Default
		strcpy(obj->ext, "per"); // Default
	}

	obj->wave = wave;
	obj->siglength = siglength;
	obj->modwtsiglength = siglength;
	obj->J = J;
	obj->MaxIter = MaxIter;
	strcpy(obj->method, method);

	if (siglength % 2 == 0) {
		obj->even = 1;
	}
	else {
		obj->even = 0;
	}

	obj->cobj = NULL;

	strcpy(obj->cmethod, "direct"); // Default
	obj->cfftset = 0;
	obj->lenlength = J + 2;
	obj->output = &obj->params[0];
	if (!strcmp(method, "dwt") || !strcmp(method, "DWT")) {
		for (i = 0; i < siglength + 2 * J * (size + 1); ++i) {
			obj->params[i] = 0.0;
		}
	}
	else if (!strcmp(method, "swt") || !strcmp(method, "SWT")) {
		for (i = 0; i < siglength * (J + 1); ++i) {
			obj->params[i] = 0.0;
		}
	}
	else if (!strcmp(method, "modwt") || !strcmp(method, "MODWT")) {
		for (i = 0; i < siglength * 2 * (J + 1); ++i) {
			obj->params[i] = 0.0;
		}
	}
	//wave_summary(obj->wave);

	return obj;
}